

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall
soul::Value::PackedData::ArrayIterator::ArrayIterator(ArrayIterator *this,PackedData *p)

{
  ArraySize AVar1;
  uint64_t uVar2;
  PackedData *p_local;
  ArrayIterator *this_local;
  
  Type::getElementType(&this->elementType,p->type);
  this->element = p->data;
  this->index = 0;
  AVar1 = Type::getArrayOrVectorSize(p->type);
  this->numElements = AVar1;
  uVar2 = Type::getPackedSizeInBytes(&this->elementType);
  this->elementSize = uVar2;
  return;
}

Assistant:

ArrayIterator (const PackedData& p)
            : elementType (p.type.getElementType()), element (p.data),
              numElements (p.type.getArrayOrVectorSize()), elementSize ((size_t) elementType.getPackedSizeInBytes())
        {}